

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O0

void __thiscall
coins_tests::coins_cache_simulation_test::test_method(coins_cache_simulation_test *this)

{
  long lVar1;
  undefined1 auVar2 [16];
  DBParams *in_RDI;
  long in_FS_OFFSET;
  CCoinsViewDB db_base;
  CCoinsViewTest base;
  undefined1 in_stack_000002a7;
  CacheTest *in_stack_000002a8;
  CCoinsView *in_stack_00000c88;
  CCoinsViewTest *in_stack_fffffffffffffec8;
  FastRandomContext *in_stack_fffffffffffffee0;
  CCoinsViewTest *in_stack_fffffffffffffee8;
  undefined1 in_stack_ffffffffffffff04 [12];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  anon_unknown.dwarf_34a75b::CCoinsViewTest::CCoinsViewTest
            (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  CacheTest::SimulationTest(in_stack_000002a8,in_stack_00000c88,(bool)in_stack_000002a7);
  fs::path::path((path *)0x5068e8,(char *)in_stack_fffffffffffffec8);
  auVar2._12_4_ = 0;
  auVar2._0_12_ = in_stack_ffffffffffffff04;
  CCoinsViewDB::CCoinsViewDB((CCoinsViewDB *)0x1000000,in_RDI,(CoinsViewOptions)(auVar2 << 0x20));
  DBParams::~DBParams((DBParams *)in_stack_fffffffffffffec8);
  CacheTest::SimulationTest(in_stack_000002a8,in_stack_00000c88,(bool)in_stack_000002a7);
  CCoinsViewDB::~CCoinsViewDB((CCoinsViewDB *)in_stack_fffffffffffffec8);
  anon_unknown.dwarf_34a75b::CCoinsViewTest::~CCoinsViewTest(in_stack_fffffffffffffec8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(coins_cache_simulation_test, CacheTest)
{
    CCoinsViewTest base{m_rng};
    SimulationTest(&base, false);

    CCoinsViewDB db_base{{.path = "test", .cache_bytes = 1 << 23, .memory_only = true}, {}};
    SimulationTest(&db_base, true);
}